

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Cnf_AddCardinConstrTest(void)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vVars_00;
  sat_solver *s;
  int *begin;
  int *piVar3;
  sat_solver *pSat;
  Vec_Int_t *vVars;
  int nVars;
  int Count;
  int status;
  int i;
  
  vVars_00 = Vec_IntStartNatural(8);
  s = sat_solver_new();
  sat_solver_setnvars(s,8);
  Cnf_AddCardinConstrPairWise(s,vVars_00,2,1);
  do {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar1 != 1) break;
    Vec_IntClear(vVars_00);
    printf("%3d : ");
    for (Count = 0; Count < 8; Count = Count + 1) {
      iVar1 = sat_solver_var_value(s,Count);
      iVar1 = Abc_Var2Lit(Count,iVar1);
      Vec_IntPush(vVars_00,iVar1);
      uVar2 = sat_solver_var_value(s,Count);
      printf("%d",(ulong)uVar2);
    }
    printf("\n");
    begin = Vec_IntArray(vVars_00);
    piVar3 = Vec_IntArray(vVars_00);
    iVar1 = Vec_IntSize(vVars_00);
    iVar1 = sat_solver_addclause(s,begin,piVar3 + iVar1);
  } while (iVar1 != 0);
  sat_solver_delete(s);
  Vec_IntFree(vVars_00);
  return;
}

Assistant:

void Cnf_AddCardinConstrTest()
{
    int i, status, Count = 1, nVars = 8;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    //Cnf_AddCardinConstr( pSat, vVars );
    Cnf_AddCardinConstrPairWise( pSat, vVars, 2, 1 );
    while ( 1 )
    {
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vVars );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vVars, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vVars), Vec_IntArray(vVars) + Vec_IntSize(vVars) );
        if ( status == 0 )
            break;
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
}